

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_gen.cpp
# Opt level: O1

bool __thiscall crn::corpus_gen::generate(corpus_gen *this,char *pCmd_line)

{
  bool bVar1;
  raw_node *prVar2;
  uint uVar3;
  dynamic_string *pdVar4;
  bool bVar5;
  bool bVar6;
  uint y;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint32 uVar11;
  param_map_const_iterator pVar12;
  uint i;
  long *plVar13;
  uint x;
  char **ppcVar14;
  long lVar15;
  uint uVar16;
  undefined4 uVar17;
  uint uVar18;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar19;
  uint x_1;
  undefined1 *puVar20;
  uint y_1;
  long lVar21;
  char *pcVar22;
  raw_node *__s1;
  file_desc *pfVar23;
  uint uVar24;
  uint uVar25;
  undefined8 unaff_R15;
  ulong uVar26;
  ulong uVar27;
  float fVar28;
  block_hash_map block_hash;
  vector<unsigned_int> remaining_blocks;
  insert_result result;
  find_files file_finder;
  image_u8 img;
  command_line_params params;
  image_u8 dst_img;
  block b;
  random rm;
  empty_type local_231;
  uint local_230;
  uint local_22c;
  hash_map_type local_228;
  uint local_1fc;
  elemental_vector local_1f8;
  undefined4 local_1e4;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  insert_result local_1d0;
  find_files local_1b8;
  uint local_19c;
  image_u8 local_198;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_168;
  ulong local_160;
  command_line_params local_158;
  ulong local_118;
  ulong local_110;
  image<crnlib::color_quad<unsigned_char,_int>_> local_108;
  undefined1 local_d8 [68];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_94 [25];
  
  crnlib::command_line_params::command_line_params(&local_158);
  bVar5 = crnlib::command_line_params::parse(&local_158,pCmd_line,7,generate::param_desc_array,true)
  ;
  if (bVar5) {
    pVar12 = crnlib::command_line_params::get_param(&local_158,"in",0);
    if ((_Rb_tree_header *)pVar12._M_node ==
        &local_158.m_param_map._M_t._M_impl.super__Rb_tree_header) {
      uVar17 = 0;
      crnlib::console::error("Must specify one or more input files using the /in option!");
    }
    else {
      iVar7 = crnlib::command_line_params::get_value_as_int
                        (&local_158,"width",0,0x1000,0x80,0x1000,0);
      iVar8 = crnlib::command_line_params::get_value_as_int
                        (&local_158,"height",0,0x1000,0x80,0x1000,0);
      local_94[0].m_u32 = 0xff000000;
      crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                (&local_108,iVar7 + 3U & 0xfffffffc,iVar8 + 3U & 0xfffffffc,0xffffffff,
                 (color_quad<unsigned_char,_int> *)&local_94[0].field_0,0xf);
      paVar19 = local_94;
      crnlib::random::random((random *)&paVar19->field_0);
      local_19c = iVar7 + 3U >> 2;
      uVar24 = (iVar8 + 3U >> 2) * local_19c;
      local_228.m_values.m_p = (raw_node *)0x0;
      local_228.m_values.m_size = 0;
      local_228.m_values.m_capacity = 0;
      local_228.m_hash_shift = 0x20;
      local_228.m_num_valid = 0;
      local_228.m_grow_threshold = 0;
      uVar9 = uVar24 + (uVar24 == 0);
      uVar10 = uVar9 * 2;
      uVar9 = uVar10 - (uVar9 & 0x55555555);
      uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
      uVar16 = ((uVar9 >> 4) + uVar9 & 0xf0f0f0f) * 0x1010101 >> 0x18;
      uVar9 = uVar10;
      if (uVar16 != 1) {
        uVar9 = uVar10 - 1 >> 0x10 | uVar10 - 1;
        uVar9 = uVar9 >> 8 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        uVar9 = (uVar9 >> 1 | uVar9) + 1;
      }
      uVar18 = 4;
      if (4 < uVar9) {
        uVar18 = uVar9;
      }
      if (uVar18 != 0) {
        paVar19 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&local_228;
        crnlib::
        hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
        ::rehash((hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                  *)&paVar19->field_0,uVar18);
      }
      bVar5 = (_Rb_tree_header *)
              local_158.m_param_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
              &local_158.m_param_map._M_t._M_impl.super__Rb_tree_header;
      uVar27 = CONCAT71((int7)((ulong)unaff_R15 >> 8),bVar5);
      uVar17 = (undefined4)uVar27;
      if (bVar5) {
        uVar10 = 0;
        bVar5 = true;
        uVar16 = 0;
        uVar9 = 0;
      }
      else {
        uVar9 = uVar10 - 1 >> 0x10 | uVar10 - 1;
        uVar9 = uVar9 >> 8 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        local_1dc = (uVar9 >> 1 | uVar9) + 1;
        if (uVar16 == 1) {
          local_1dc = uVar10;
        }
        if (local_1dc < 5) {
          local_1dc = 4;
        }
        local_230 = 0;
        local_1fc = 0;
        local_1e0 = 0;
        local_1d8 = 0;
        local_22c = uVar24;
        do {
          paVar19 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                    local_158.m_param_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          iVar7 = crnlib::dynamic_string::compare((dynamic_string *)(paVar19->c + 0x20),"in",false);
          if (iVar7 == 0) {
            local_1e4 = (undefined4)uVar27;
            if (*(uint32 *)(paVar19->c + 0x38) == 0) {
              crnlib::console::error("Must follow /in parameter with a filename!\n");
              goto LAB_00105d09;
            }
            bVar5 = *(uint32 *)(paVar19->c + 0x38) != 0;
            if (bVar5) {
              uVar27 = 0;
              local_168 = paVar19;
              do {
                lVar21 = *(long *)(local_168->c + 0x30);
                local_1b8.m_files.m_p = (file_desc *)0x0;
                local_1b8.m_files.m_size = 0;
                local_1b8.m_files.m_capacity = 0;
                local_1b8.m_last_error = 0;
                uVar26 = uVar27 * 0x10;
                pcVar22 = *(char **)(lVar21 + 8 + uVar26);
                local_118 = uVar27;
                pVar12 = crnlib::command_line_params::get_param(&local_158,"deep",0);
                if (pcVar22 == (char *)0x0) {
                  pcVar22 = "";
                }
                bVar6 = crnlib::find_files::find
                                  (&local_1b8,pcVar22,
                                   (_Rb_tree_header *)pVar12._M_node !=
                                   &local_158.m_param_map._M_t._M_impl.super__Rb_tree_header | 4);
                plVar13 = (long *)(lVar21 + uVar26 + 8);
                if (bVar6) {
                  if (local_1b8.m_files.m_size == 0) {
                    pcVar22 = (char *)*plVar13;
                    if (pcVar22 == (char *)0x0) {
                      pcVar22 = "";
                    }
                    iVar7 = 1;
                    crnlib::console::warning("No files found: %s",pcVar22);
                  }
                  else {
                    iVar7 = 0;
                    if (local_1b8.m_files.m_size != 0) {
                      uVar27 = 0;
                      do {
                        pfVar23 = local_1b8.m_files.m_p;
                        uVar26 = uVar27 * 9;
                        pcVar22 = local_1b8.m_files.m_p[uVar27].m_fullname.m_pStr;
                        if (pcVar22 == (char *)0x0) {
                          pcVar22 = "";
                        }
                        local_110 = uVar27;
                        crnlib::console::printf("Loading image: %s",pcVar22);
                        ppcVar14 = &pfVar23[uVar27].m_fullname.m_pStr;
                        local_198.m_width = 0;
                        local_198.m_height = 0;
                        local_198.m_pitch = 0;
                        local_198.m_total = 0;
                        local_198.m_comp_flags = 0xf;
                        local_198.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                        local_198.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                        local_198.m_pixel_buf.m_size = 0;
                        local_198.m_pixel_buf.m_capacity = 0;
                        pcVar22 = *ppcVar14;
                        if (pcVar22 == (char *)0x0) {
                          pcVar22 = "";
                        }
                        bVar6 = crnlib::image_utils::read_from_file(&local_198,pcVar22,0);
                        if (bVar6) {
                          pVar12 = crnlib::command_line_params::get_param(&local_158,"alpha",0);
                          uVar18 = local_198.m_width;
                          uVar3 = local_198.m_height;
                          if (((_Rb_tree_header *)pVar12._M_node ==
                               &local_158.m_param_map._M_t._M_impl.super__Rb_tree_header) &&
                             (local_198.m_height != 0)) {
                            uVar10 = 0;
                            do {
                              if (local_198.m_width != 0) {
                                uVar9 = 0;
                                do {
                                  local_198.m_pPixels[local_198.m_pitch * uVar10 + uVar9].field_0.
                                  field_0.a = 0xff;
                                  uVar9 = uVar9 + 1;
                                } while (uVar9 < local_198.m_width);
                              }
                              uVar10 = uVar10 + 1;
                            } while (uVar10 < local_198.m_height);
                          }
                          fVar28 = crnlib::command_line_params::get_value_as_float
                                             (&local_158,"blockpercentage",0,0.1,0.001,1.0,0);
                          uVar10 = uVar18 + 3 >> 2;
                          uVar9 = (uVar3 + 3 >> 2) * uVar10;
                          uVar27 = (ulong)(fVar28 * (float)uVar9);
                          uVar26 = uVar27 & 0xffffffff;
                          if ((uint)uVar27 < 2) {
                            uVar26 = 1;
                          }
                          local_1f8.m_p = (void *)0x0;
                          local_1f8.m_size = 0;
                          local_1f8.m_capacity = 0;
                          if (uVar9 != 0) {
                            crnlib::elemental_vector::increase_capacity
                                      (&local_1f8,uVar9,uVar9 == 1,4,(object_mover)0x0,false);
                            memset((void *)((local_1f8._8_8_ & 0xffffffff) * 4 + (long)local_1f8.m_p
                                           ),0,(ulong)(uVar9 - local_1f8.m_size) << 2);
                            local_1f8.m_size = uVar9;
                            uVar27 = 0;
                            do {
                              *(int *)((long)local_1f8.m_p + uVar27 * 4) = (int)uVar27;
                              uVar27 = uVar27 + 1;
                            } while (uVar9 != uVar27);
                          }
                          local_1e0 = local_1e0 + 1;
                          uVar9 = local_22c;
                          local_1d4 = uVar10;
                          do {
                            if (local_1f8.m_size == 0) break;
                            uVar24 = crnlib::random::irand
                                               ((random *)&local_94[0].field_0,0,local_1f8.m_size);
                            uVar16 = *(uint *)((long)local_1f8.m_p + (ulong)uVar24 * 4);
                            if (uVar24 + 1 < local_1f8.m_size) {
                              *(undefined4 *)((long)local_1f8.m_p + (ulong)uVar24 * 4) =
                                   *(undefined4 *)
                                    ((long)local_1f8.m_p + (ulong)(local_1f8.m_size - 1) * 4);
                            }
                            if (local_1f8.m_size != 0) {
                              local_1f8.m_size = local_1f8.m_size - 1;
                            }
                            uVar24 = uVar16 / uVar10;
                            uVar16 = uVar16 % uVar10;
                            puVar20 = local_d8 + 3;
                            lVar21 = 0;
                            do {
                              uVar10 = uVar24 << 2 | (uint)lVar21;
                              if ((int)(local_198.m_height - 1) <= (int)uVar10) {
                                uVar10 = local_198.m_height - 1;
                              }
                              if ((int)(uVar24 << 2) < 0) {
                                uVar10 = 0;
                              }
                              lVar15 = 0;
                              do {
                                uVar25 = uVar16 << 2 | (uint)lVar15;
                                if ((int)(local_198.m_width - 1) <= (int)uVar25) {
                                  uVar25 = local_198.m_width - 1;
                                }
                                if ((int)(uVar16 << 2) < 0) {
                                  uVar25 = 0;
                                }
                                uVar25 = uVar25 + uVar10 * local_198.m_pitch;
                                puVar20[lVar15 * 4 + -3] =
                                     local_198.m_pPixels[uVar25].field_0.field_0.r;
                                puVar20[lVar15 * 4 + -2] =
                                     local_198.m_pPixels[uVar25].field_0.field_0.g;
                                puVar20[lVar15 * 4 + -1] =
                                     local_198.m_pPixels[uVar25].field_0.field_0.b;
                                puVar20[lVar15 * 4] = local_198.m_pPixels[uVar25].field_0.field_0.a;
                                lVar15 = lVar15 + 1;
                              } while (lVar15 != 4);
                              lVar21 = lVar21 + 1;
                              puVar20 = puVar20 + 0x10;
                            } while (lVar21 != 4);
                            local_1d0.first.m_pTable = (hash_map_type *)0x0;
                            local_1d0.first.m_index = 0;
                            local_1d0.second = false;
                            local_160 = uVar26;
                            if (local_228.m_values.m_size == 0) {
LAB_001058b0:
                              uVar18 = local_228.m_values.m_size * 2;
                              if (local_228.m_values.m_size * 2 < 5) {
                                uVar18 = 4;
                              }
                              crnlib::
                              hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                              ::rehash(&local_228,uVar18);
                              bVar6 = crnlib::
                                      hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                                      ::insert_no_grow(&local_228,&local_1d0,(block *)local_d8,
                                                       &local_231);
                              if (!bVar6) {
                                crnlib_fail("\"insert() failed\"",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_hash_map.h"
                                            ,0x204);
                              }
                            }
                            else {
                              uVar11 = crnlib::fast_hash(local_d8,0x40);
                              prVar2 = local_228.m_values.m_p;
                              uVar10 = uVar11 * -0x61c88647 >> ((byte)local_228.m_hash_shift & 0x1f)
                              ;
                              uVar27 = (ulong)uVar10;
                              __s1 = local_228.m_values.m_p + uVar27;
                              if (local_228.m_values.m_p[uVar27].m_bits[0x41] == '\0') {
LAB_00105830:
                                uVar9 = local_22c;
                                if (local_228.m_grow_threshold <= local_228.m_num_valid)
                                goto LAB_001058b0;
                                lVar21 = 0;
                                do {
                                  __s1->m_bits[lVar21 * 4] = local_d8[lVar21 * 4];
                                  __s1->m_bits[lVar21 * 4 + 1] = local_d8[lVar21 * 4 + 1];
                                  __s1->m_bits[lVar21 * 4 + 2] = local_d8[lVar21 * 4 + 2];
                                  __s1->m_bits[lVar21 * 4 + 3] = local_d8[lVar21 * 4 + 3];
                                  lVar21 = lVar21 + 1;
                                } while (lVar21 != 0x10);
                                *(empty_type *)(__s1->m_bits + 0x40) = local_231;
                                __s1->m_bits[0x41] = '\x01';
                                local_228.m_num_valid = local_228.m_num_valid + 1;
                                local_1d0.second = true;
                              }
                              else {
                                iVar7 = bcmp(__s1,local_d8,0x40);
                                if (iVar7 != 0) {
                                  uVar9 = local_228.m_values.m_size - 1;
                                  do {
                                    iVar7 = (int)uVar27;
                                    uVar16 = iVar7 - 1;
                                    if (iVar7 == 0) {
                                      uVar16 = uVar9;
                                    }
                                    uVar27 = (ulong)uVar16;
                                    __s1 = __s1 + -1;
                                    if (iVar7 == 0) {
                                      __s1 = prVar2 + uVar9;
                                    }
                                    bVar6 = uVar10 != uVar16;
                                    if (uVar10 == uVar16) {
LAB_00105825:
                                      bVar1 = false;
                                      goto LAB_00105827;
                                    }
                                    if (__s1->m_bits[0x41] == '\0') {
                                      bVar6 = true;
                                      goto LAB_00105825;
                                    }
                                    iVar7 = bcmp(__s1,local_d8,0x40);
                                  } while (iVar7 != 0);
                                  local_1d0.first.m_pTable = &local_228;
                                  local_1d0.second = false;
                                  bVar1 = true;
                                  bVar6 = false;
                                  local_1d0.first.m_index = uVar16;
LAB_00105827:
                                  uVar10 = uVar16;
                                  if (bVar6) goto LAB_00105830;
                                  uVar9 = local_22c;
                                  if (!bVar1) goto LAB_001058b0;
                                  goto LAB_00105903;
                                }
                                local_1d0.second = false;
                              }
                              local_1d0.first.m_pTable = &local_228;
                              uVar9 = local_22c;
                              local_1d0.first.m_index = uVar10;
                            }
LAB_00105903:
                            uVar27 = local_160;
                            uVar26 = local_160;
                            uVar10 = local_1d4;
                            if (local_1d0.second != false) {
                              if (local_228.m_num_valid == uVar9) {
                                if (local_228.m_values.m_size != 0) {
                                  if (local_228.m_values.m_p != (raw_node *)0x0) {
                                    crnlib::crnlib_free(local_228.m_values.m_p);
                                    local_228.m_values.m_p = (raw_node *)0x0;
                                    local_228.m_values.m_size = 0;
                                    local_228.m_values.m_capacity = 0;
                                  }
                                  local_228.m_hash_shift = 0x20;
                                  local_228.m_num_valid = 0;
                                  local_228.m_grow_threshold = 0;
                                }
                                if (local_228.m_values.m_size < local_1dc) {
                                  crnlib::
                                  hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                                  ::rehash(&local_228,local_1dc);
                                }
                              }
                              uVar10 = local_1d4;
                              puVar20 = local_d8 + 3;
                              lVar21 = 0;
                              do {
                                uVar16 = (local_230 / local_19c) * 4 + (int)lVar21;
                                lVar15 = 0;
                                do {
                                  uVar24 = local_108.m_pitch * uVar16 + (local_230 % local_19c) * 4
                                           + (int)lVar15;
                                  local_108.m_pPixels[uVar24].field_0.field_0.r =
                                       puVar20[lVar15 * 4 + -3];
                                  local_108.m_pPixels[uVar24].field_0.field_0.g =
                                       puVar20[lVar15 * 4 + -2];
                                  local_108.m_pPixels[uVar24].field_0.field_0.b =
                                       puVar20[lVar15 * 4 + -1];
                                  local_108.m_pPixels[uVar24].field_0.field_0.a =
                                       puVar20[lVar15 * 4];
                                  lVar15 = lVar15 + 1;
                                } while (lVar15 != 4);
                                lVar21 = lVar21 + 1;
                                puVar20 = puVar20 + 0x10;
                              } while (lVar21 != 4);
                              local_230 = local_230 + 1;
                              if (uVar9 == local_230) {
                                sort_blocks((corpus_gen *)(ulong)uVar16,&local_108);
                                crnlib::dynamic_string::dynamic_string
                                          ((dynamic_string *)&local_1d0,cVarArg,"test_%u.tga",
                                           (ulong)local_1fc);
                                pcVar22 = (char *)CONCAT44(local_1d0.first._12_4_,
                                                           local_1d0.first.m_index);
                                if (pcVar22 == (char *)0x0) {
                                  pcVar22 = "";
                                }
                                crnlib::console::printf("Writing image: %s",pcVar22);
                                pcVar22 = (char *)CONCAT44(local_1d0.first._12_4_,
                                                           local_1d0.first.m_index);
                                if (pcVar22 == (char *)0x0) {
                                  pcVar22 = "";
                                }
                                crnlib::image_utils::write_to_file(pcVar22,&local_108,0,-1);
                                if (local_108.m_total != 0) {
                                  uVar26 = 0;
                                  do {
                                    local_108.m_pPixels[uVar26].field_0 =
                                         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3
                                          )0xff000000;
                                    uVar26 = uVar26 + 1;
                                  } while (uVar26 < local_108.m_total);
                                }
                                lVar21 = CONCAT44(local_1d0.first._12_4_,local_1d0.first.m_index);
                                if ((lVar21 != 0) &&
                                   ((*(uint *)(lVar21 + -8) ^ *(uint *)(lVar21 + -4)) == 0xffffffff)
                                   ) {
                                  crnlib::crnlib_free((void *)(lVar21 + -0x10));
                                }
                                local_1fc = local_1fc + 1;
                                local_230 = 0;
                              }
                              local_1d8 = local_1d8 + 1;
                              uVar26 = (ulong)((int)uVar27 - 1);
                            }
                          } while ((int)uVar26 != 0);
                          if (local_1f8.m_p != (void *)0x0) {
                            crnlib::crnlib_free(local_1f8.m_p);
                          }
                        }
                        else {
                          pcVar22 = *ppcVar14;
                          if (pcVar22 == (char *)0x0) {
                            pcVar22 = "";
                          }
                          crnlib::console::warning("Failed loading image file: %s",pcVar22);
                        }
                        if (local_198.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
                          crnlib::crnlib_free(local_198.m_pixel_buf.m_p);
                        }
                        uVar27 = local_110 + 1;
                      } while (uVar27 < (local_1b8.m_files._8_8_ & 0xffffffff));
                      iVar7 = 0;
                    }
                  }
                }
                else {
                  pcVar22 = (char *)*plVar13;
                  if (pcVar22 == (char *)0x0) {
                    pcVar22 = "";
                  }
                  iVar7 = 7;
                  crnlib::console::warning("Failed finding files: %s",pcVar22);
                }
                uVar27 = uVar26;
                if (local_1b8.m_files.m_p != (file_desc *)0x0) {
                  uVar27 = 0;
                  if ((local_1b8.m_files._8_8_ & 0xffffffff) != 0) {
                    lVar21 = (local_1b8.m_files._8_8_ & 0xffffffff) * 0x48;
                    pfVar23 = local_1b8.m_files.m_p;
                    do {
                      crnlib::find_files::file_desc::~file_desc(pfVar23);
                      pfVar23 = pfVar23 + 1;
                      lVar21 = lVar21 + -0x48;
                    } while (lVar21 != 0);
                  }
                  crnlib::crnlib_free(local_1b8.m_files.m_p);
                }
                paVar19 = local_168;
                if ((iVar7 != 7) && (iVar7 != 0)) break;
                uVar27 = local_118 + 1;
                bVar5 = uVar27 < *(uint *)(local_168->c + 0x38);
              } while (bVar5);
            }
            if (bVar5) goto LAB_00105d09;
          }
          local_158.m_param_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)&paVar19->field_0);
          bVar5 = (_Rb_tree_header *)
                  local_158.m_param_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
                  &local_158.m_param_map._M_t._M_impl.super__Rb_tree_header;
          uVar27 = CONCAT71((int7)(uVar27 >> 8),bVar5);
          uVar17 = (undefined4)uVar27;
        } while (!bVar5);
        bVar5 = local_230 == 0;
        uVar10 = local_1d8;
        uVar9 = local_1fc;
        uVar16 = local_1e0;
      }
      local_1e4 = uVar17;
      if (!bVar5) {
        sort_blocks((corpus_gen *)&paVar19->field_0,&local_108);
        crnlib::dynamic_string::dynamic_string
                  ((dynamic_string *)local_d8,cVarArg,"test_%u.tga",(ulong)uVar9);
        pcVar22 = (char *)local_d8._8_8_;
        if ((char *)local_d8._8_8_ == (char *)0x0) {
          pcVar22 = "";
        }
        crnlib::console::printf("Writing image: %s",pcVar22);
        pcVar22 = "";
        if ((char *)local_d8._8_8_ != (char *)0x0) {
          pcVar22 = (char *)local_d8._8_8_;
        }
        crnlib::image_utils::write_to_file(pcVar22,&local_108,0,-1);
        uVar9 = uVar9 + 1;
        crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_d8);
      }
      crnlib::console::printf
                ("Found %u input images, %u output images, %u total blocks",(ulong)uVar16,
                 (ulong)uVar9,(ulong)uVar10);
LAB_00105d09:
      uVar17 = local_1e4;
      if (local_228.m_values.m_size != 0) {
        if (local_228.m_values.m_p != (raw_node *)0x0) {
          crnlib::crnlib_free(local_228.m_values.m_p);
          local_228.m_values.m_p = (raw_node *)0x0;
          local_228.m_values.m_size = 0;
          local_228.m_values.m_capacity = 0;
        }
        local_228.m_hash_shift = 0x20;
        local_228.m_num_valid = 0;
        local_228.m_grow_threshold = 0;
      }
      if (local_228.m_values.m_p != (raw_node *)0x0) {
        crnlib::crnlib_free(local_228.m_values.m_p);
      }
      if (local_108.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
        crnlib::crnlib_free(local_108.m_pixel_buf.m_p);
      }
    }
  }
  else {
    uVar17 = 0;
  }
  std::
  _Rb_tree<crnlib::dynamic_string,_std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>,_std::_Select1st<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
  ::~_Rb_tree(&local_158.m_param_map._M_t);
  pdVar4 = local_158.m_params.m_p;
  if (local_158.m_params.m_p != (dynamic_string *)0x0) {
    if ((ulong)local_158.m_params.m_size != 0) {
      lVar21 = 0;
      do {
        lVar15 = *(long *)((long)&pdVar4->m_pStr + lVar21);
        if ((lVar15 != 0) && ((*(uint *)(lVar15 + -8) ^ *(uint *)(lVar15 + -4)) == 0xffffffff)) {
          crnlib::crnlib_free((void *)(lVar15 + -0x10));
        }
        lVar21 = lVar21 + 0x10;
      } while ((ulong)local_158.m_params.m_size << 4 != lVar21);
    }
    crnlib::crnlib_free(local_158.m_params.m_p);
  }
  return (bool)((byte)uVar17 & 1);
}

Assistant:

bool corpus_gen::generate(const char* pCmd_line)
    {
        static const command_line_params::param_desc param_desc_array[] =
        {
            { "corpus_gen", 0, false },
            { "in", 1, true },
            { "deep", 0, false },
            { "blockpercentage", 1, false },
            { "width", 1, false },
            { "height", 1, false },
            { "alpha", 0, false },
        };

        command_line_params params;
        if (!params.parse(pCmd_line, CRNLIB_ARRAY_SIZE(param_desc_array), param_desc_array, true))
        {
            return false;
        }

        if (!params.has_key("in"))
        {
            console::error("Must specify one or more input files using the /in option!");
            return false;
        }

        uint num_dst_blocks_x = params.get_value_as_int("width", 0, 4096, 128, 4096);
        num_dst_blocks_x = (num_dst_blocks_x + 3) / 4;
        uint num_dst_blocks_y = params.get_value_as_int("height", 0, 4096, 128, 4096);
        num_dst_blocks_y = (num_dst_blocks_y + 3) / 4;

        const uint total_dst_blocks = num_dst_blocks_x * num_dst_blocks_y;
        image_u8 dst_img(num_dst_blocks_x * 4, num_dst_blocks_y * 4);
        uint next_dst_block = 0;
        uint total_dst_images = 0;

        crnlib::random rm;

        block_hash_map block_hash;
        block_hash.reserve(total_dst_blocks);

        uint total_images_loaded = 0;
        uint total_blocks_written = 0;

        command_line_params::param_map_const_iterator it = params.begin();
        for (; it != params.end(); ++it)
        {
            if (it->first != "in")
            {
                continue;
            }

            if (it->second.m_values.empty())
            {
                console::error("Must follow /in parameter with a filename!\n");
                return false;
            }

            for (uint in_value_index = 0; in_value_index < it->second.m_values.size(); in_value_index++)
            {
                const dynamic_string& filespec = it->second.m_values[in_value_index];

                find_files file_finder;
                if (!file_finder.find(filespec.get_ptr(), find_files::cFlagAllowFiles | (params.has_key("deep") ? find_files::cFlagRecursive : 0)))
                {
                    console::warning("Failed finding files: %s", filespec.get_ptr());
                    continue;
                }

                if (file_finder.get_files().empty())
                {
                    console::warning("No files found: %s", filespec.get_ptr());
                    return false;
                }

                const find_files::file_desc_vec& files = file_finder.get_files();

                for (uint file_index = 0; file_index < files.size(); file_index++)
                {
                    const find_files::file_desc& file_desc = files[file_index];

                    console::printf("Loading image: %s", file_desc.m_fullname.get_ptr());

                    image_u8 img;
                    if (!image_utils::read_from_file(img, file_desc.m_fullname.get_ptr(), 0))
                    {
                        console::warning("Failed loading image file: %s", file_desc.m_fullname.get_ptr());
                        continue;
                    }

                    if (!params.has_key("alpha"))
                    {
                        for (uint y = 0; y < img.get_height(); y++)
                        {
                            for (uint x = 0; x < img.get_width(); x++)
                            {
                                img(x, y).a = 255;
                            }
                        }
                    }

                    total_images_loaded++;

                    uint width = img.get_width();
                    uint height = img.get_height();

                    uint num_blocks_x = (width + 3) / 4;
                    uint num_blocks_y = (height + 3) / 4;
                    uint total_blocks = num_blocks_x * num_blocks_y;

                    float percentage = params.get_value_as_float("blockpercentage", 0, .1f, .001f, 1.0f);
                    uint total_rand_blocks = math::maximum<uint>(1U, (uint)(total_blocks * percentage));

                    crnlib::vector<uint> remaining_blocks(total_blocks);
                    for (uint i = 0; i < total_blocks; i++)
                    {
                        remaining_blocks[i] = i;
                    }

                    uint num_blocks_remaining = total_rand_blocks;
                    while (num_blocks_remaining)
                    {
                        if (remaining_blocks.empty())
                        {
                            break;
                        }

                        uint rand_block_index = rm.irand(0, remaining_blocks.size());
                        uint block_index = remaining_blocks[rand_block_index];
                        remaining_blocks.erase_unordered(rand_block_index);

                        uint block_y = block_index / num_blocks_x;
                        uint block_x = block_index % num_blocks_x;

                        block b;

                        for (uint y = 0; y < 4; y++)
                        {
                            for (uint x = 0; x < 4; x++)
                            {
                                b.m_c[x + y * 4] = img.get_clamped(block_x * 4 + x, block_y * 4 + y);
                            }
                        }

                        if (!block_hash.insert(b).second)
                        {
                            continue;
                        }
                        if (block_hash.size() == total_dst_blocks)
                        {
                            block_hash.clear();
                            block_hash.reserve(total_dst_blocks);
                        }

                        uint dst_block_x = next_dst_block % num_dst_blocks_x;
                        uint dst_block_y = next_dst_block / num_dst_blocks_x;
                        for (uint y = 0; y < 4; y++)
                        {
                            for (uint x = 0; x < 4; x++)
                            {
                                dst_img(dst_block_x * 4 + x, dst_block_y * 4 + y) = b.m_c[x + y * 4];
                            }
                        }

                        next_dst_block++;
                        if (total_dst_blocks == next_dst_block)
                        {
                            sort_blocks(dst_img);

                            dynamic_string dst_filename(cVarArg, "test_%u.tga", total_dst_images);
                            console::printf("Writing image: %s", dst_filename.get_ptr());
                            image_utils::write_to_file(dst_filename.get_ptr(), dst_img, 0);

                            dst_img.set_all(color_quad_u8::make_black());

                            next_dst_block = 0;

                            total_dst_images++;
                        }

                        total_blocks_written++;

                        num_blocks_remaining--;
                    }
                } // file_index
            } // in_value_index
        }

        if (next_dst_block)
        {
            sort_blocks(dst_img);

            dynamic_string dst_filename(cVarArg, "test_%u.tga", total_dst_images);
            console::printf("Writing image: %s", dst_filename.get_ptr());
            image_utils::write_to_file(dst_filename.get_ptr(), dst_img, 0);

            next_dst_block = 0;

            total_dst_images++;
        }

        console::printf("Found %u input images, %u output images, %u total blocks", total_images_loaded, total_dst_images, total_blocks_written);

        return true;
    }